

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O1

WJTL_STATUS TestUnmarshallLists(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  JL_STATUS JVar33;
  JL_STATUS JVar34;
  JL_STATUS JVar35;
  JL_STATUS JVar36;
  long lVar37;
  WJTL_STATUS WVar38;
  undefined8 *puVar39;
  JlMarshallElement *pJVar40;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  bool Condition_02;
  bool Condition_03;
  bool Condition_04;
  bool Condition_05;
  bool Condition_06;
  bool Condition_07;
  bool Condition_08;
  bool Condition_09;
  bool Condition_10;
  bool Condition_11;
  bool Condition_12;
  bool Condition_13;
  bool Condition_14;
  bool Condition_15;
  bool Condition_16;
  bool Condition_17;
  bool Condition_18;
  size_t errorAtPos;
  JlMarshallElement marshalTheStruct [2];
  TheStruct theStruct;
  JlMarshallElement marshalSubSubStruct [1];
  JlMarshallElement marshalSubStruct [2];
  size_t local_2e0;
  JlMarshallElement local_2d8;
  undefined4 local_278;
  char *local_270;
  undefined1 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined4 local_230;
  undefined2 local_22c;
  JlMarshallElement *local_228;
  undefined4 local_220;
  int local_210;
  int local_20c;
  long local_200;
  int *local_1f8;
  long local_1f0;
  int local_1e8;
  int local_1e4;
  long local_1d8;
  int *local_1d0;
  long local_1c8;
  long local_170;
  int *local_168;
  JlMarshallElement local_158;
  JlMarshallElement local_f8;
  undefined4 local_98;
  char *local_90;
  undefined1 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined2 local_4c;
  JlMarshallElement *local_48;
  undefined4 local_40;
  
  local_2e0 = 0;
  puVar39 = &DAT_00141770;
  pJVar40 = &local_158;
  for (lVar37 = 0xc; lVar37 != 0; lVar37 = lVar37 + -1) {
    *(undefined8 *)pJVar40 = *puVar39;
    puVar39 = puVar39 + 1;
    pJVar40 = (JlMarshallElement *)&pJVar40->Name;
  }
  local_2d8.ChildStructDescription = &local_f8;
  local_f8.Type = JL_DATA_TYPE_DICTIONARY;
  local_f8.Name = "SubSubFixList";
  local_f8.IsArray = true;
  local_f8.FieldOffset = 0;
  local_f8.FieldSize = 0x10;
  local_f8.CountFieldOffset = 0x10;
  local_f8.CountFieldSize = 8;
  local_f8.ArrayFieldSize = 0x10;
  local_f8.ArrayItemSize = 4;
  local_f8.NumberType = JL_NUM_TYPE_NONE;
  local_f8.IsHex = false;
  local_f8.IsBase64 = false;
  local_f8.ChildStructDescriptionCount = 1;
  local_98 = 5;
  local_90 = "SubSubVarList";
  local_88 = 1;
  local_80 = 0x18;
  local_78 = 8;
  local_70 = 0x20;
  local_68 = 8;
  local_60 = 0;
  local_58 = 4;
  local_50 = 0;
  local_4c = 0;
  local_40 = 1;
  local_2d8.Type = JL_DATA_TYPE_DICTIONARY;
  local_2d8.Name = "SubFixList";
  local_2d8.IsArray = true;
  local_2d8.FieldOffset = 0;
  local_2d8.FieldSize = 0xa0;
  local_2d8.CountFieldOffset = 0xa0;
  local_2d8.CountFieldSize = 8;
  local_2d8.ArrayFieldSize = 0xa0;
  local_2d8.ArrayItemSize = 0x28;
  local_2d8.NumberType = JL_NUM_TYPE_NONE;
  local_2d8.IsHex = false;
  local_2d8.IsBase64 = false;
  local_2d8.ChildStructDescriptionCount = 2;
  local_278 = 5;
  local_270 = "SubVarList";
  local_268 = 1;
  local_260 = 0xa8;
  local_258 = 8;
  local_250 = 0xb0;
  local_248 = 8;
  local_240 = 0;
  local_238 = 0x28;
  local_230 = 0;
  local_22c = 0;
  local_220 = 2;
  local_228 = local_2d8.ChildStructDescription;
  local_f8.ChildStructDescription = &local_158;
  local_48 = &local_158;
  memset(&local_210,0,0xb8);
  JVar33 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":1},{\"Num\":2}], \"SubSubVarList\": [{\"Num\":3},{\"Num\":4}] },    { \"SubSubFixList\": [{\"Num\":5},{\"Num\":6}], \"SubSubVarList\": [{\"Num\":7},{\"Num\":8}] }  ],  \"SubVarList\":[     { \"SubSubFixList\": [{\"Num\":9},{\"Num\":10}], \"SubSubVarList\": [{\"Num\":11},{\"Num\":12}] },    { \"SubSubFixList\": [{\"Num\":13},{\"Num\":14}], \"SubSubVarList\": [{\"Num\":15},{\"Num\":16}] }  ]}"
                          ,&local_2d8,2,&local_210,&local_2e0);
  WjTestLib_Assert(JVar33 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":1},{\\\"Num\\\":2}], \\\"SubSubVarList\\\": [{\\\"Num\\\":3},{\\\"Num\\\":4}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":5},{\\\"Num\\\":6}], \\\"SubSubVarList\\\": [{\\\"Num\\\":7},{\\\"Num\\\":8}] }\" \"  ],\" \"  \\\"SubVarList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":9},{\\\"Num\\\":10}], \\\"SubSubVarList\\\": [{\\\"Num\\\":11},{\\\"Num\\\":12}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":13},{\\\"Num\\\":14}], \\\"SubSubVarList\\\": [{\\\"Num\\\":15},{\\\"Num\\\":16}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fb);
  Condition = local_2e0 == 0;
  WjTestLib_Assert(Condition,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fd);
  Condition_00 = local_170 == 2;
  WjTestLib_Assert(Condition_00,"2 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fe);
  Condition_01 = local_200 == 2;
  WjTestLib_Assert(Condition_01,"2 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5ff);
  Condition_02 = local_210 == 1;
  WjTestLib_Assert(Condition_02,"1 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x600);
  Condition_03 = local_20c == 2;
  WjTestLib_Assert(Condition_03,"2 == theStruct.SubFixList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x601);
  Condition_04 = local_1f0 == 2;
  WjTestLib_Assert(Condition_04,"2 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x602);
  iVar1 = *local_1f8;
  WjTestLib_Assert(iVar1 == 3,"3 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x603);
  iVar2 = local_1f8[1];
  WjTestLib_Assert(iVar2 == 4,"4 == theStruct.SubFixList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x604);
  Condition_05 = local_1d8 == 2;
  WjTestLib_Assert(Condition_05,"2 == theStruct.SubFixList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x605);
  Condition_06 = local_1e8 == 5;
  WjTestLib_Assert(Condition_06,"5 == theStruct.SubFixList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x606);
  Condition_07 = local_1e4 == 6;
  WjTestLib_Assert(Condition_07,"6 == theStruct.SubFixList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x607);
  Condition_08 = local_1c8 == 2;
  WjTestLib_Assert(Condition_08,"2 == theStruct.SubFixList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x608);
  iVar3 = *local_1d0;
  WjTestLib_Assert(iVar3 == 7,"7 == theStruct.SubFixList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x609);
  iVar4 = local_1d0[1];
  WjTestLib_Assert(iVar4 == 8,"8 == theStruct.SubFixList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60a);
  lVar37 = *(long *)(local_168 + 4);
  WjTestLib_Assert(lVar37 == 2,"2 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60c);
  iVar5 = *local_168;
  WjTestLib_Assert(iVar5 == 9,"9 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60d);
  iVar6 = local_168[1];
  WjTestLib_Assert(iVar6 == 10,"10 == theStruct.SubVarList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60e);
  lVar24 = *(long *)(local_168 + 8);
  WjTestLib_Assert(lVar24 == 2,"2 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60f);
  iVar7 = **(int **)(local_168 + 6);
  WjTestLib_Assert(iVar7 == 0xb,"11 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x610);
  Condition_09 = *(int *)(*(long *)(local_168 + 6) + 4) == 0xc;
  WjTestLib_Assert(Condition_09,"12 == theStruct.SubVarList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x611);
  lVar25 = *(long *)(local_168 + 0xe);
  WjTestLib_Assert(lVar25 == 2,"2 == theStruct.SubVarList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x612);
  iVar8 = local_168[10];
  WjTestLib_Assert(iVar8 == 0xd,"13 == theStruct.SubVarList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x613);
  iVar9 = local_168[0xb];
  WjTestLib_Assert(iVar9 == 0xe,"14 == theStruct.SubVarList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x614);
  lVar26 = *(long *)(local_168 + 0x12);
  WjTestLib_Assert(lVar26 == 2,"2 == theStruct.SubVarList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x615);
  iVar10 = **(int **)(local_168 + 0x10);
  WjTestLib_Assert(iVar10 == 0xf,"15 == theStruct.SubVarList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x616);
  Condition_10 = *(int *)(*(long *)(local_168 + 0x10) + 4) == 0x10;
  WjTestLib_Assert(Condition_10,"16 == theStruct.SubVarList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x617);
  JVar34 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":41},{\"Num\":42}], \"SubSubVarList\": [{\"Num\":43},{\"Num\":44}] },    { \"SubSubFixList\": [{\"Num\":45},{\"Num\":46}], \"SubSubVarList\": [{\"Num\":47},{\"Num\":48}] }  ]}"
                          ,&local_2d8,2,&local_210,&local_2e0);
  WjTestLib_Assert(JVar34 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":41},{\\\"Num\\\":42}], \\\"SubSubVarList\\\": [{\\\"Num\\\":43},{\\\"Num\\\":44}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":45},{\\\"Num\\\":46}], \\\"SubSubVarList\\\": [{\\\"Num\\\":47},{\\\"Num\\\":48}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x621);
  Condition_11 = local_2e0 == 0;
  WjTestLib_Assert(Condition_11,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x623);
  Condition_12 = local_170 == 2;
  WjTestLib_Assert(Condition_12,"2 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x624);
  Condition_13 = local_200 == 2;
  WjTestLib_Assert(Condition_13,"2 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x625);
  Condition_14 = local_210 == 0x29;
  WjTestLib_Assert(Condition_14,"41 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x626);
  WjTestLib_Assert(local_20c == 0x2a,"42 == theStruct.SubFixList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x627);
  Condition_15 = local_1f0 == 2;
  WjTestLib_Assert(Condition_15,"2 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x628);
  iVar11 = *local_1f8;
  WjTestLib_Assert(iVar11 == 0x2b,"43 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x629);
  iVar12 = local_1f8[1];
  WjTestLib_Assert(iVar12 == 0x2c,"44 == theStruct.SubFixList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62a);
  WjTestLib_Assert(local_1d8 == 2,"2 == theStruct.SubFixList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62b);
  WjTestLib_Assert(local_1e8 == 0x2d,"45 == theStruct.SubFixList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62c);
  WjTestLib_Assert(local_1e4 == 0x2e,"46 == theStruct.SubFixList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62d);
  WjTestLib_Assert(local_1c8 == 2,"2 == theStruct.SubFixList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62e);
  iVar13 = *local_1d0;
  WjTestLib_Assert(iVar13 == 0x2f,"47 == theStruct.SubFixList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62f);
  iVar14 = local_1d0[1];
  WjTestLib_Assert(iVar14 == 0x30,"48 == theStruct.SubFixList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x630);
  lVar27 = *(long *)(local_168 + 4);
  WjTestLib_Assert(lVar27 == 2,"2 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x632);
  iVar15 = *local_168;
  WjTestLib_Assert(iVar15 == 9,"9 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x633);
  iVar16 = local_168[1];
  WjTestLib_Assert(iVar16 == 10,"10 == theStruct.SubVarList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x634);
  lVar28 = *(long *)(local_168 + 8);
  WjTestLib_Assert(lVar28 == 2,"2 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x635);
  iVar17 = **(int **)(local_168 + 6);
  WjTestLib_Assert(iVar17 == 0xb,"11 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x636);
  Condition_16 = *(int *)(*(long *)(local_168 + 6) + 4) == 0xc;
  WjTestLib_Assert(Condition_16,"12 == theStruct.SubVarList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x637);
  lVar29 = *(long *)(local_168 + 0xe);
  WjTestLib_Assert(lVar29 == 2,"2 == theStruct.SubVarList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x638);
  iVar18 = local_168[10];
  WjTestLib_Assert(iVar18 == 0xd,"13 == theStruct.SubVarList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x639);
  iVar19 = local_168[0xb];
  WjTestLib_Assert(iVar19 == 0xe,"14 == theStruct.SubVarList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63a);
  lVar30 = *(long *)(local_168 + 0x12);
  WjTestLib_Assert(lVar30 == 2,"2 == theStruct.SubVarList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63b);
  iVar20 = **(int **)(local_168 + 0x10);
  WjTestLib_Assert(iVar20 == 0xf,"15 == theStruct.SubVarList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63c);
  Condition_17 = *(int *)(*(long *)(local_168 + 0x10) + 4) == 0x10;
  WjTestLib_Assert(Condition_17,"16 == theStruct.SubVarList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63d);
  JVar35 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":20}], \"SubSubVarList\": [{\"Num\":21}] }  ],  \"SubVarList\":[     { \"SubSubFixList\": [{\"Num\":22}], \"SubSubVarList\": [{\"Num\":23}] }  ]}"
                          ,&local_2d8,2,&local_210,&local_2e0);
  WjTestLib_Assert(JVar35 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":20}], \\\"SubSubVarList\\\": [{\\\"Num\\\":21}] }\" \"  ],\" \"  \\\"SubVarList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":22}], \\\"SubSubVarList\\\": [{\\\"Num\\\":23}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x649);
  Condition_18 = local_2e0 == 0;
  WjTestLib_Assert(Condition_18,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64b);
  WjTestLib_Assert(local_170 == 1,"1 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64c);
  WjTestLib_Assert(local_200 == 1,"1 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64d);
  WjTestLib_Assert(local_210 == 0x14,"20 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64e);
  WjTestLib_Assert(local_1f0 == 1,"1 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64f);
  iVar21 = *local_1f8;
  WjTestLib_Assert(iVar21 == 0x15,"21 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x650);
  lVar31 = *(long *)(local_168 + 4);
  WjTestLib_Assert(lVar31 == 1,"1 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x652);
  iVar22 = *local_168;
  WjTestLib_Assert(iVar22 == 0x16,"22 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x653);
  lVar32 = *(long *)(local_168 + 8);
  WjTestLib_Assert(lVar32 == 1,"1 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x654);
  iVar23 = **(int **)(local_168 + 6);
  WjTestLib_Assert(iVar23 == 0x17,"23 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x655);
  JVar36 = JlUnmarshallFreeStructAllocs(&local_2d8,2,&local_210);
  WVar38 = WJTL_STATUS_SUCCESS;
  if (iVar2 != 4 ||
      (iVar1 != 3 ||
      (!Condition_04 ||
      ((!Condition_03 || (!Condition_02 || !Condition_01)) ||
      (!Condition || (!Condition_00 || JVar33 != JL_STATUS_SUCCESS)))))) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if ((iVar6 != 10 || iVar5 != 9) ||
      ((lVar37 != 2 || iVar4 != 8) ||
      (iVar3 != 7 || ((!Condition_08 || !Condition_07) || (!Condition_06 || !Condition_05))))) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_10 || (iVar10 != 0xf || (lVar26 != 2 || (iVar9 != 0xe || iVar8 != 0xd)))) ||
      ((lVar25 != 2 || !Condition_09) || (iVar7 != 0xb || lVar24 != 2))) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if (iVar12 != 0x2c ||
      (iVar11 != 0x2b ||
      (!Condition_15 ||
      ((local_20c != 0x2a || (!Condition_14 || !Condition_13)) ||
      (!Condition_11 || (!Condition_12 || JVar34 != JL_STATUS_SUCCESS)))))) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if ((iVar16 != 10 || iVar15 != 9) ||
      ((lVar27 != 2 || iVar14 != 0x30) ||
      (iVar13 != 0x2f ||
      ((local_1c8 != 2 || local_1e4 != 0x2e) || (local_1e8 != 0x2d || local_1d8 != 2))))) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_17 || (iVar20 != 0xf || (lVar30 != 2 || (iVar19 != 0xe || iVar18 != 0xd)))) ||
      ((lVar29 != 2 || !Condition_16) || (iVar17 != 0xb || lVar28 != 2))) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if ((iVar22 != 0x16 || lVar31 != 1) ||
      (iVar21 != 0x15 ||
      ((local_1f0 != 1 || (local_210 != 0x14 || local_200 != 1)) ||
      (!Condition_18 || (local_170 != 1 || JVar35 != JL_STATUS_SUCCESS))))) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if (JVar36 != JL_STATUS_SUCCESS) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if (iVar23 != 0x17) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  if (lVar32 != 1) {
    WVar38 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar36 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x658);
  return WVar38;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallLists
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint32_t        Num;
    } SubSubStruct;

    typedef struct
    {
        SubSubStruct   SubSubFixList [4];
        size_t         SubSubFixListCount;
        SubSubStruct*  SubSubVarList;
        size_t         SubSubVarListCount;
    } SubStruct;

    typedef struct
    {
        SubStruct   SubFixList [4];
        size_t      SubFixListCount;
        SubStruct*  SubVarList;
        size_t      SubVarListCount;
    } TheStruct;

    JlMarshallElement marshalSubSubStruct[] = {
        JlMarshallUnsigned( SubSubStruct, Num, "Num" )
    };

    JlMarshallElement marshalSubStruct[] = {
        JlMarshallStructFixedArray( SubStruct, SubSubFixList, SubSubFixListCount, "SubSubFixList", SubSubStruct, marshalSubSubStruct, NumElements(marshalSubSubStruct) ),
        JlMarshallStructArray( SubStruct, SubSubVarList, SubSubVarListCount, "SubSubVarList", SubSubStruct, marshalSubSubStruct, NumElements(marshalSubSubStruct) )
    };

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStructFixedArray( TheStruct, SubFixList, SubFixListCount, "SubFixList", SubStruct, marshalSubStruct, NumElements(marshalSubStruct) ),
        JlMarshallStructArray( TheStruct, SubVarList, SubVarListCount, "SubVarList", SubStruct, marshalSubStruct, NumElements(marshalSubStruct) )
    };

    TheStruct theStruct = {{{{{0}}}}};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":1},{\"Num\":2}], \"SubSubVarList\": [{\"Num\":3},{\"Num\":4}] },"
        "    { \"SubSubFixList\": [{\"Num\":5},{\"Num\":6}], \"SubSubVarList\": [{\"Num\":7},{\"Num\":8}] }"
        "  ],"
        "  \"SubVarList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":9},{\"Num\":10}], \"SubSubVarList\": [{\"Num\":11},{\"Num\":12}] },"
        "    { \"SubSubFixList\": [{\"Num\":13},{\"Num\":14}], \"SubSubVarList\": [{\"Num\":15},{\"Num\":16}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.SubFixListCount );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubFixList[0].Num );
        JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 3 == theStruct.SubFixList[0].SubSubVarList[0].Num );
        JL_ASSERT( 4 == theStruct.SubFixList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubFixListCount );
        JL_ASSERT( 5 == theStruct.SubFixList[1].SubSubFixList[0].Num );
        JL_ASSERT( 6 == theStruct.SubFixList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubVarListCount );
        JL_ASSERT( 7 == theStruct.SubFixList[1].SubSubVarList[0].Num );
        JL_ASSERT( 8 == theStruct.SubFixList[1].SubSubVarList[1].Num );

      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 9 == theStruct.SubVarList[0].SubSubFixList[0].Num );
        JL_ASSERT( 10 == theStruct.SubVarList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 11 == theStruct.SubVarList[0].SubSubVarList[0].Num );
        JL_ASSERT( 12 == theStruct.SubVarList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubFixListCount );
        JL_ASSERT( 13 == theStruct.SubVarList[1].SubSubFixList[0].Num );
        JL_ASSERT( 14 == theStruct.SubVarList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubVarListCount );
        JL_ASSERT( 15 == theStruct.SubVarList[1].SubSubVarList[0].Num );
        JL_ASSERT( 16 == theStruct.SubVarList[1].SubSubVarList[1].Num );

    // Partial replace
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":41},{\"Num\":42}], \"SubSubVarList\": [{\"Num\":43},{\"Num\":44}] },"
        "    { \"SubSubFixList\": [{\"Num\":45},{\"Num\":46}], \"SubSubVarList\": [{\"Num\":47},{\"Num\":48}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.SubFixListCount );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 41 == theStruct.SubFixList[0].SubSubFixList[0].Num );
        JL_ASSERT( 42 == theStruct.SubFixList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 43 == theStruct.SubFixList[0].SubSubVarList[0].Num );
        JL_ASSERT( 44 == theStruct.SubFixList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubFixListCount );
        JL_ASSERT( 45 == theStruct.SubFixList[1].SubSubFixList[0].Num );
        JL_ASSERT( 46 == theStruct.SubFixList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubVarListCount );
        JL_ASSERT( 47 == theStruct.SubFixList[1].SubSubVarList[0].Num );
        JL_ASSERT( 48 == theStruct.SubFixList[1].SubSubVarList[1].Num );
      // Rest should be same from before
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 9 == theStruct.SubVarList[0].SubSubFixList[0].Num );
        JL_ASSERT( 10 == theStruct.SubVarList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 11 == theStruct.SubVarList[0].SubSubVarList[0].Num );
        JL_ASSERT( 12 == theStruct.SubVarList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubFixListCount );
        JL_ASSERT( 13 == theStruct.SubVarList[1].SubSubFixList[0].Num );
        JL_ASSERT( 14 == theStruct.SubVarList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubVarListCount );
        JL_ASSERT( 15 == theStruct.SubVarList[1].SubSubVarList[0].Num );
        JL_ASSERT( 16 == theStruct.SubVarList[1].SubSubVarList[1].Num );

    // Replace with some values
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":20}], \"SubSubVarList\": [{\"Num\":21}] }"
        "  ],"
        "  \"SubVarList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":22}], \"SubSubVarList\": [{\"Num\":23}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 1 == theStruct.SubFixListCount );
      JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 20 == theStruct.SubFixList[0].SubSubFixList[0].Num );
      JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 21 == theStruct.SubFixList[0].SubSubVarList[0].Num );

      JL_ASSERT( 1 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 22 == theStruct.SubVarList[0].SubSubFixList[0].Num );
      JL_ASSERT( 1 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 23 == theStruct.SubVarList[0].SubSubVarList[0].Num );

    // Free and make sure no memory leak
    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    return TestReturn;
}